

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O2

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  cmake *this_00;
  MessageType t;
  string message;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_60;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == __lhs) {
    std::__cxx11::string::string
              ((string *)&message,"called with incorrect number of arguments",(allocator *)&local_60
              );
    cmCommand::SetError(&this->super_cmCommand,&message);
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    bVar2 = std::operator==(__lhs,"SEND_ERROR");
    if (bVar2) {
      t = FATAL_ERROR;
LAB_002ae29b:
      bVar3 = false;
      local_60.Begin._M_current = __lhs + 1;
LAB_002ae2a5:
      bVar2 = false;
    }
    else {
      bVar2 = std::operator==(__lhs,"FATAL_ERROR");
      if (!bVar2) {
        bVar2 = std::operator==(__lhs,"WARNING");
        if (bVar2) {
          t = WARNING;
          goto LAB_002ae29b;
        }
        bVar2 = std::operator==(__lhs,"AUTHOR_WARNING");
        if (bVar2) {
          bVar2 = cmake::GetDevWarningsAsErrors(this_00,(this->super_cmCommand).Makefile);
          if (bVar2) {
            t = AUTHOR_ERROR;
          }
          else {
            bVar3 = cmake::GetSuppressDevWarnings(this_00,(this->super_cmCommand).Makefile);
            t = AUTHOR_WARNING;
            if (bVar3) goto LAB_002ae3ae;
          }
          goto LAB_002ae2f3;
        }
        bVar2 = std::operator==(__lhs,"STATUS");
        if (bVar2) {
          bVar3 = true;
          t = MESSAGE;
          local_60.Begin._M_current = __lhs + 1;
        }
        else {
          bVar2 = std::operator==(__lhs,"DEPRECATION");
          if (bVar2) {
            bVar2 = cmake::GetDeprecatedWarningsAsErrors(this_00,(this->super_cmCommand).Makefile);
            if (bVar2) {
              t = DEPRECATION_ERROR;
            }
            else {
              bVar3 = cmake::GetSuppressDeprecatedWarnings(this_00,(this->super_cmCommand).Makefile)
              ;
              if (bVar3) goto LAB_002ae3ae;
              t = DEPRECATION_WARNING;
            }
            goto LAB_002ae2f3;
          }
          t = MESSAGE;
          bVar3 = false;
          local_60.Begin._M_current = __lhs;
        }
        goto LAB_002ae2a5;
      }
      bVar2 = true;
      t = FATAL_ERROR;
LAB_002ae2f3:
      local_60.Begin._M_current = __lhs + 1;
      bVar3 = false;
    }
    local_60.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = '\0';
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&message,&local_60,local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (t == MESSAGE) {
      if (bVar3) {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,message._M_dataplus._M_p,-1.0);
      }
      else {
        cmSystemTools::Message(message._M_dataplus._M_p,(char *)0x0);
      }
    }
    else {
      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,t,&message,true);
    }
    if (bVar2 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
  }
  std::__cxx11::string::~string((string *)&message);
LAB_002ae3ae:
  return pbVar1 != __lhs;
}

Assistant:

bool cmMessageCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();

  cmake::MessageType type = cmake::MESSAGE;
  bool status = false;
  bool fatal = false;
  cmake* cm = this->Makefile->GetCMakeInstance();
  if (*i == "SEND_ERROR")
    {
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "FATAL_ERROR")
    {
    fatal = true;
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "WARNING")
    {
    type = cmake::WARNING;
    ++i;
    }
  else if (*i == "AUTHOR_WARNING")
    {
    if (cm->GetDevWarningsAsErrors(this->Makefile))
      {
      fatal = true;
      type = cmake::AUTHOR_ERROR;
      }
    else if (!cm->GetSuppressDevWarnings(this->Makefile))
      {
      type = cmake::AUTHOR_WARNING;
      }
    else
      {
      return true;
      }
    ++i;
    }
  else if (*i == "STATUS")
    {
    status = true;
    ++i;
    }
  else if (*i == "DEPRECATION")
    {
    if (cm->GetDeprecatedWarningsAsErrors(this->Makefile))
      {
      fatal = true;
      type = cmake::DEPRECATION_ERROR;
      }
    else if (!cm->GetSuppressDeprecatedWarnings(this->Makefile))
      {
      type = cmake::DEPRECATION_WARNING;
      }
    else
      {
      return true;
      }
    ++i;
    }

  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());

  if (type != cmake::MESSAGE)
    {
    // we've overriden the message type, above, so force IssueMessage to use it
    this->Makefile->IssueMessage(type, message, true);
    }
  else
    {
    if (status)
      {
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    else
      {
      cmSystemTools::Message(message.c_str());
      }
    }
  if(fatal)
    {
    cmSystemTools::SetFatalErrorOccured();
    }
  return true;
}